

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_refs.c
# Opt level: O3

RK_S32 mpp_hevc_frame_rps(HEVCContext *s)

{
  byte *pbVar1;
  ShortTermRPS *pSVar2;
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  uint uVar6;
  RefPicList *list;
  ulong uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  long lVar10;
  
  pSVar2 = (s->sh).short_term_rps;
  if (pSVar2 == (ShortTermRPS *)0x0) {
    s->rps[1].nb_refs = 0;
    s->rps[0].nb_refs = 0;
  }
  else {
    lVar5 = 0xd02;
    do {
      pbVar1 = (byte *)((long)s->vps_list + lVar5 + -0x30);
      *pbVar1 = *pbVar1 & 0xf9;
      auVar3 = _DAT_00277a10;
      lVar5 = lVar5 + 0x40;
    } while (lVar5 != 0x1142);
    lVar5 = 0x898;
    auVar9 = _DAT_00277a00;
    do {
      if (SUB164(auVar9 ^ auVar3,4) == -0x80000000 && SUB164(auVar9 ^ auVar3,0) < -0x7ffffffb) {
        *(undefined4 *)((long)s->vps_list + lVar5 + -0x30) = 0;
        *(undefined4 *)((long)s->sps_list + lVar5 + 0x58) = 0;
      }
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
      lVar5 = lVar5 + 0x210;
    } while (lVar5 != 0xec8);
    if (0 < pSVar2->num_delta_pocs) {
      uVar7 = 0;
      do {
        if (pSVar2->used[uVar7] == '\0') {
          uVar6 = 2;
        }
        else {
          uVar6 = (uint)(pSVar2->num_negative_pics <= uVar7);
        }
        iVar4 = add_candidate_ref(s,(RefPicList *)((long)s->rps[0].ref + (ulong)(uVar6 * 0x108)),
                                  pSVar2->delta_poc[uVar7] + s->poc,2,
                                  (uint)(pSVar2->used[uVar7] != '\0'));
        if (iVar4 < 0) {
          return iVar4;
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)pSVar2->num_delta_pocs);
    }
    if ((s->sh).long_term_rps.nb_refs != '\0') {
      uVar7 = 0;
      do {
        bVar8 = (s->sh).long_term_rps.used[uVar7] != '\0';
        list = s->rps + 4;
        if (bVar8) {
          list = s->rps + 3;
        }
        iVar4 = add_candidate_ref(s,list,(s->sh).long_term_rps.poc[uVar7],4,(uint)bVar8);
        if (iVar4 < 0) {
          return iVar4;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < (s->sh).long_term_rps.nb_refs);
    }
    lVar5 = 0xcd0;
    do {
      mpp_hevc_unref_frame(s,(HEVCFrame *)((long)s->vps_list + lVar5 + -0x30),0);
      lVar5 = lVar5 + 0x40;
    } while (lVar5 != 0x1110);
    if (s->nal_unit_type == NAL_CRA_NUT) {
      lVar5 = 0xd04;
      do {
        if ((*(int *)((long)s->vps_list + lVar5 + -0x30) != 0xff) &&
           (s->poc < *(int *)((long)s->vps_list + lVar5 + -0x50))) {
          h265d_flush(s->h265dctx);
          return 0;
        }
        lVar5 = lVar5 + 0x40;
      } while (lVar5 != 0x1144);
    }
  }
  return 0;
}

Assistant:

RK_S32 mpp_hevc_frame_rps(HEVCContext *s)
{

    const ShortTermRPS *short_rps = s->sh.short_term_rps;
    const LongTermRPS  *long_rps  = &s->sh.long_term_rps;
    RefPicList               *rps = s->rps;
    RK_S32  ret;
    RK_U32  i;

    if (!short_rps) {
        rps[0].nb_refs = rps[1].nb_refs = 0;
        return 0;
    }

    /* clear the reference flags on all frames except the current one */
    for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
        HEVCFrame *frame = &s->DPB[i];
        mark_ref(frame, 0);
    }

    for (i = 0; i < NB_RPS_TYPE; i++)
        rps[i].nb_refs = 0;

    /* add the short refs */
    for (i = 0; short_rps && (RK_S32)i < short_rps->num_delta_pocs; i++) {
        int poc = s->poc + short_rps->delta_poc[i];
        int list;

        if (!short_rps->used[i])
            list = ST_FOLL;
        else if (i < short_rps->num_negative_pics)
            list = ST_CURR_BEF;
        else
            list = ST_CURR_AFT;

        ret = add_candidate_ref(s, &rps[list], poc, HEVC_FRAME_FLAG_SHORT_REF, ST_FOLL != list);
        if (ret < 0)
            return ret;
    }

    /* add the long refs */
    for (i = 0; long_rps && i < long_rps->nb_refs; i++) {
        int poc  = long_rps->poc[i];
        int list = long_rps->used[i] ? LT_CURR : LT_FOLL;

        ret = add_candidate_ref(s, &rps[list], poc, HEVC_FRAME_FLAG_LONG_REF, LT_FOLL != list);
        if (ret < 0)
            return ret;
    }
    /* release any frames that are now unused */
    for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
        mpp_hevc_unref_frame(s, &s->DPB[i], 0);
    }
    /*
     * flush for CRA frame if there has frame poc > cur poc in dpb.
     */
    if (IS_CRA(s)) {
        for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
            HEVCFrame *ref = &s->DPB[i];

            if ((ref->slot_index != 0xff) && (ref->poc > s->poc)) {
                h265d_flush(s->h265dctx);
                break;
            }
        }
    }

    return 0;
}